

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# stream.h
# Opt level: O3

void __thiscall
rapidjson::GenericReader<rapidjson::UTF8<char>,rapidjson::UTF8<char>,rapidjson::CrtAllocator>::
ParseValue<0u,rapidjson::GenericStringStream<rapidjson::UTF8<char>>,rapidjson::GenericDocument<rapidjson::UTF8<char>,rapidjson::MemoryPoolAllocator<rapidjson::CrtAllocator>,rapidjson::CrtAllocator>>
          (GenericReader<rapidjson::UTF8<char>,rapidjson::UTF8<char>,rapidjson::CrtAllocator> *this,
          GenericStringStream<rapidjson::UTF8<char>_> *is,
          GenericDocument<rapidjson::UTF8<char>,_rapidjson::MemoryPoolAllocator<rapidjson::CrtAllocator>,_rapidjson::CrtAllocator>
          *handler)

{
  byte *pbVar1;
  byte bVar2;
  byte bVar3;
  Ch *pCVar4;
  undefined1 auVar5 [16];
  undefined1 auVar6 [16];
  bool bVar7;
  bool bVar8;
  bool bVar9;
  int iVar10;
  GenericValue<rapidjson::UTF8<char>,_rapidjson::MemoryPoolAllocator<rapidjson::CrtAllocator>_>
  *pGVar11;
  byte *pbVar12;
  undefined4 uVar13;
  ulong uVar14;
  Ch *pCVar15;
  byte bVar16;
  uint16_t uVar17;
  SizeType SVar18;
  ushort uVar19;
  byte *pbVar20;
  int iVar21;
  int iVar22;
  uint uVar23;
  ulong uVar24;
  long lVar25;
  uint uVar26;
  ulong uVar27;
  bool bVar28;
  undefined1 auVar29 [16];
  undefined1 auVar30 [16];
  double dVar31;
  undefined1 auVar32 [64];
  undefined1 auVar33 [16];
  undefined1 in_ZMM2 [64];
  undefined1 auVar34 [16];
  undefined1 in_ZMM3 [64];
  undefined8 in_XMM4_Qa;
  undefined8 in_XMM4_Qb;
  
  bVar3 = *is->src_;
  if (bVar3 < 0x6e) {
    if (bVar3 == 0x22) {
      ParseString<0u,rapidjson::GenericStringStream<rapidjson::UTF8<char>>,rapidjson::GenericDocument<rapidjson::UTF8<char>,rapidjson::MemoryPoolAllocator<rapidjson::CrtAllocator>,rapidjson::CrtAllocator>>
                (this,is,handler,false);
      return;
    }
    if (bVar3 != 0x5b) {
      if (bVar3 != 0x66) {
        ParseNumber<0u,rapidjson::GenericStringStream<rapidjson::UTF8<char>>,rapidjson::GenericDocument<rapidjson::UTF8<char>,rapidjson::MemoryPoolAllocator<rapidjson::CrtAllocator>,rapidjson::CrtAllocator>>
                  (this,is,handler);
        return;
      }
      pCVar4 = is->src_;
      if (*pCVar4 != 'f') {
        __assert_fail("is.Peek() == \'f\'",
                      "/workspace/llm4binary/github/license_all_cmakelists_25/satoshigeyuki[P]Centaurus/rapidjson/include/rapidjson/reader.h"
                      ,0x371,
                      "void rapidjson::GenericReader<rapidjson::UTF8<>, rapidjson::UTF8<>>::ParseFalse(InputStream &, Handler &) [SourceEncoding = rapidjson::UTF8<>, TargetEncoding = rapidjson::UTF8<>, StackAllocator = rapidjson::CrtAllocator, parseFlags = 0U, InputStream = rapidjson::GenericStringStream<rapidjson::UTF8<>>, Handler = rapidjson::GenericDocument<rapidjson::UTF8<>>]"
                     );
      }
      pCVar15 = pCVar4 + 1;
      is->src_ = pCVar15;
      if (pCVar4[1] == 'a') {
        pCVar15 = pCVar4 + 2;
        is->src_ = pCVar15;
        if (pCVar4[2] == 'l') {
          pCVar15 = pCVar4 + 3;
          is->src_ = pCVar15;
          if (pCVar4[3] == 's') {
            pCVar15 = pCVar4 + 4;
            is->src_ = pCVar15;
            if (pCVar4[4] == 'e') {
              is->src_ = pCVar4 + 5;
              pGVar11 = internal::Stack<rapidjson::CrtAllocator>::
                        Push<rapidjson::GenericValue<rapidjson::UTF8<char>,rapidjson::MemoryPoolAllocator<rapidjson::CrtAllocator>>>
                                  (&handler->stack_,1);
              (pGVar11->data_).n = (Number)0x0;
              (pGVar11->data_).s.str = (Ch *)0x0;
              (pGVar11->data_).f.flags = 9;
              return;
            }
          }
        }
      }
      if (*(int *)(this + 0x30) == 0) {
        pCVar4 = is->head_;
        *(undefined4 *)(this + 0x30) = 3;
        *(long *)(this + 0x38) = (long)pCVar15 - (long)pCVar4;
        return;
      }
      __assert_fail("!HasParseError()",
                    "/workspace/llm4binary/github/license_all_cmakelists_25/satoshigeyuki[P]Centaurus/rapidjson/include/rapidjson/reader.h"
                    ,0x379,
                    "void rapidjson::GenericReader<rapidjson::UTF8<>, rapidjson::UTF8<>>::ParseFalse(InputStream &, Handler &) [SourceEncoding = rapidjson::UTF8<>, TargetEncoding = rapidjson::UTF8<>, StackAllocator = rapidjson::CrtAllocator, parseFlags = 0U, InputStream = rapidjson::GenericStringStream<rapidjson::UTF8<>>, Handler = rapidjson::GenericDocument<rapidjson::UTF8<>>]"
                   );
    }
    if (*is->src_ != '[') {
      __assert_fail("is.Peek() == \'[\'",
                    "/workspace/llm4binary/github/license_all_cmakelists_25/satoshigeyuki[P]Centaurus/rapidjson/include/rapidjson/reader.h"
                    ,0x327,
                    "void rapidjson::GenericReader<rapidjson::UTF8<>, rapidjson::UTF8<>>::ParseArray(InputStream &, Handler &) [SourceEncoding = rapidjson::UTF8<>, TargetEncoding = rapidjson::UTF8<>, StackAllocator = rapidjson::CrtAllocator, parseFlags = 0U, InputStream = rapidjson::GenericStringStream<rapidjson::UTF8<>>, Handler = rapidjson::GenericDocument<rapidjson::UTF8<>>]"
                   );
    }
    is->src_ = is->src_ + 1;
    pGVar11 = internal::Stack<rapidjson::CrtAllocator>::
              Push<rapidjson::GenericValue<rapidjson::UTF8<char>,rapidjson::MemoryPoolAllocator<rapidjson::CrtAllocator>>>
                        (&handler->stack_,1);
    (pGVar11->data_).n = (Number)0x0;
    (pGVar11->data_).s.str = (Ch *)0x0;
    (pGVar11->data_).f.flags = 4;
    pbVar12 = is->src_;
    while (((ulong)*pbVar12 < 0x21 && ((0x100002600U >> ((ulong)*pbVar12 & 0x3f) & 1) != 0))) {
      pbVar12 = pbVar12 + 1;
    }
    is->src_ = pbVar12;
    if (*(int *)(this + 0x30) == 0) {
      if (*pbVar12 == 0x5d) {
        is->src_ = pbVar12 + 1;
        bVar9 = GenericDocument<rapidjson::UTF8<char>,_rapidjson::MemoryPoolAllocator<rapidjson::CrtAllocator>,_rapidjson::CrtAllocator>
                ::EndArray(handler,0);
        if (!bVar9) {
          if (*(int *)(this + 0x30) != 0) {
            __assert_fail("!HasParseError()",
                          "/workspace/llm4binary/github/license_all_cmakelists_25/satoshigeyuki[P]Centaurus/rapidjson/include/rapidjson/reader.h"
                          ,0x332,
                          "void rapidjson::GenericReader<rapidjson::UTF8<>, rapidjson::UTF8<>>::ParseArray(InputStream &, Handler &) [SourceEncoding = rapidjson::UTF8<>, TargetEncoding = rapidjson::UTF8<>, StackAllocator = rapidjson::CrtAllocator, parseFlags = 0U, InputStream = rapidjson::GenericStringStream<rapidjson::UTF8<>>, Handler = rapidjson::GenericDocument<rapidjson::UTF8<>>]"
                         );
          }
LAB_00102670:
          pbVar12 = is->src_;
          uVar13 = 0x10;
LAB_00102678:
          pCVar4 = is->head_;
          *(undefined4 *)(this + 0x30) = uVar13;
          *(long *)(this + 0x38) = (long)pbVar12 - (long)pCVar4;
        }
      }
      else {
        ParseValue<0u,rapidjson::GenericStringStream<rapidjson::UTF8<char>>,rapidjson::GenericDocument<rapidjson::UTF8<char>,rapidjson::MemoryPoolAllocator<rapidjson::CrtAllocator>,rapidjson::CrtAllocator>>
                  (this,is,handler);
        if (*(int *)(this + 0x30) == 0) {
          SVar18 = 0;
          do {
            pbVar12 = is->src_;
            while (((ulong)*pbVar12 < 0x21 && ((0x100002600U >> ((ulong)*pbVar12 & 0x3f) & 1) != 0))
                  ) {
              pbVar12 = pbVar12 + 1;
            }
            is->src_ = pbVar12;
            SVar18 = SVar18 + 1;
            if (*pbVar12 != 0x2c) {
              if (*pbVar12 != 0x5d) {
                uVar13 = 7;
                goto LAB_00102678;
              }
              is->src_ = pbVar12 + 1;
              bVar9 = GenericDocument<rapidjson::UTF8<char>,_rapidjson::MemoryPoolAllocator<rapidjson::CrtAllocator>,_rapidjson::CrtAllocator>
                      ::EndArray(handler,SVar18);
              if (bVar9) {
                return;
              }
              if (*(int *)(this + 0x30) != 0) {
                __assert_fail("!HasParseError()",
                              "/workspace/llm4binary/github/license_all_cmakelists_25/satoshigeyuki[P]Centaurus/rapidjson/include/rapidjson/reader.h"
                              ,0x344,
                              "void rapidjson::GenericReader<rapidjson::UTF8<>, rapidjson::UTF8<>>::ParseArray(InputStream &, Handler &) [SourceEncoding = rapidjson::UTF8<>, TargetEncoding = rapidjson::UTF8<>, StackAllocator = rapidjson::CrtAllocator, parseFlags = 0U, InputStream = rapidjson::GenericStringStream<rapidjson::UTF8<>>, Handler = rapidjson::GenericDocument<rapidjson::UTF8<>>]"
                             );
              }
              goto LAB_00102670;
            }
            pbVar12 = pbVar12 + 1;
            is->src_ = pbVar12;
            while (((ulong)*pbVar12 < 0x21 && ((0x100002600U >> ((ulong)*pbVar12 & 0x3f) & 1) != 0))
                  ) {
              pbVar12 = pbVar12 + 1;
            }
            is->src_ = pbVar12;
            ParseValue<0u,rapidjson::GenericStringStream<rapidjson::UTF8<char>>,rapidjson::GenericDocument<rapidjson::UTF8<char>,rapidjson::MemoryPoolAllocator<rapidjson::CrtAllocator>,rapidjson::CrtAllocator>>
                      (this,is,handler);
          } while (*(int *)(this + 0x30) == 0);
        }
      }
    }
    return;
  }
  if (bVar3 == 0x7b) {
    if (*is->src_ != '{') {
      __assert_fail("is.Peek() == \'{\'",
                    "/workspace/llm4binary/github/license_all_cmakelists_25/satoshigeyuki[P]Centaurus/rapidjson/include/rapidjson/reader.h"
                    ,0x2e3,
                    "void rapidjson::GenericReader<rapidjson::UTF8<>, rapidjson::UTF8<>>::ParseObject(InputStream &, Handler &) [SourceEncoding = rapidjson::UTF8<>, TargetEncoding = rapidjson::UTF8<>, StackAllocator = rapidjson::CrtAllocator, parseFlags = 0U, InputStream = rapidjson::GenericStringStream<rapidjson::UTF8<>>, Handler = rapidjson::GenericDocument<rapidjson::UTF8<>>]"
                   );
    }
    is->src_ = is->src_ + 1;
    pGVar11 = internal::Stack<rapidjson::CrtAllocator>::
              Push<rapidjson::GenericValue<rapidjson::UTF8<char>,rapidjson::MemoryPoolAllocator<rapidjson::CrtAllocator>>>
                        (&handler->stack_,1);
    (pGVar11->data_).n = (Number)0x0;
    (pGVar11->data_).s.str = (Ch *)0x0;
    (pGVar11->data_).f.flags = 3;
    pbVar12 = is->src_;
    while (((ulong)*pbVar12 < 0x21 && ((0x100002600U >> ((ulong)*pbVar12 & 0x3f) & 1) != 0))) {
      pbVar12 = pbVar12 + 1;
    }
    is->src_ = pbVar12;
    if (*(int *)(this + 0x30) == 0) {
      if (*pbVar12 == 0x7d) {
        is->src_ = pbVar12 + 1;
        bVar9 = GenericDocument<rapidjson::UTF8<char>,_rapidjson::MemoryPoolAllocator<rapidjson::CrtAllocator>,_rapidjson::CrtAllocator>
                ::EndObject(handler,0);
        if (bVar9) {
          return;
        }
        if (*(int *)(this + 0x30) != 0) {
          __assert_fail("!HasParseError()",
                        "/workspace/llm4binary/github/license_all_cmakelists_25/satoshigeyuki[P]Centaurus/rapidjson/include/rapidjson/reader.h"
                        ,0x2ee,
                        "void rapidjson::GenericReader<rapidjson::UTF8<>, rapidjson::UTF8<>>::ParseObject(InputStream &, Handler &) [SourceEncoding = rapidjson::UTF8<>, TargetEncoding = rapidjson::UTF8<>, StackAllocator = rapidjson::CrtAllocator, parseFlags = 0U, InputStream = rapidjson::GenericStringStream<rapidjson::UTF8<>>, Handler = rapidjson::GenericDocument<rapidjson::UTF8<>>]"
                       );
        }
LAB_001024c7:
        pbVar12 = is->src_;
        uVar13 = 0x10;
      }
      else {
        if (*pbVar12 == 0x22) {
          SVar18 = 0;
          do {
            ParseString<0u,rapidjson::GenericStringStream<rapidjson::UTF8<char>>,rapidjson::GenericDocument<rapidjson::UTF8<char>,rapidjson::MemoryPoolAllocator<rapidjson::CrtAllocator>,rapidjson::CrtAllocator>>
                      (this,is,handler,true);
            if (*(int *)(this + 0x30) != 0) {
              return;
            }
            pbVar12 = is->src_;
            while (((ulong)*pbVar12 < 0x21 && ((0x100002600U >> ((ulong)*pbVar12 & 0x3f) & 1) != 0))
                  ) {
              pbVar12 = pbVar12 + 1;
            }
            is->src_ = pbVar12;
            if (*pbVar12 != 0x3a) {
              uVar13 = 5;
              goto LAB_00102518;
            }
            pbVar12 = pbVar12 + 1;
            is->src_ = pbVar12;
            while (((ulong)*pbVar12 < 0x21 && ((0x100002600U >> ((ulong)*pbVar12 & 0x3f) & 1) != 0))
                  ) {
              pbVar12 = pbVar12 + 1;
            }
            is->src_ = pbVar12;
            ParseValue<0u,rapidjson::GenericStringStream<rapidjson::UTF8<char>>,rapidjson::GenericDocument<rapidjson::UTF8<char>,rapidjson::MemoryPoolAllocator<rapidjson::CrtAllocator>,rapidjson::CrtAllocator>>
                      (this,is,handler);
            if (*(int *)(this + 0x30) != 0) {
              return;
            }
            pbVar12 = is->src_;
            while (((ulong)*pbVar12 < 0x21 && ((0x100002600U >> ((ulong)*pbVar12 & 0x3f) & 1) != 0))
                  ) {
              pbVar12 = pbVar12 + 1;
            }
            is->src_ = pbVar12;
            SVar18 = SVar18 + 1;
            if (*pbVar12 != 0x2c) {
              if (*pbVar12 != 0x7d) {
                uVar13 = 6;
                goto LAB_00102518;
              }
              is->src_ = pbVar12 + 1;
              bVar9 = GenericDocument<rapidjson::UTF8<char>,_rapidjson::MemoryPoolAllocator<rapidjson::CrtAllocator>,_rapidjson::CrtAllocator>
                      ::EndObject(handler,SVar18);
              if (bVar9) {
                return;
              }
              if (*(int *)(this + 0x30) != 0) {
                __assert_fail("!HasParseError()",
                              "/workspace/llm4binary/github/license_all_cmakelists_25/satoshigeyuki[P]Centaurus/rapidjson/include/rapidjson/reader.h"
                              ,0x313,
                              "void rapidjson::GenericReader<rapidjson::UTF8<>, rapidjson::UTF8<>>::ParseObject(InputStream &, Handler &) [SourceEncoding = rapidjson::UTF8<>, TargetEncoding = rapidjson::UTF8<>, StackAllocator = rapidjson::CrtAllocator, parseFlags = 0U, InputStream = rapidjson::GenericStringStream<rapidjson::UTF8<>>, Handler = rapidjson::GenericDocument<rapidjson::UTF8<>>]"
                             );
              }
              goto LAB_001024c7;
            }
            pbVar12 = pbVar12 + 1;
            is->src_ = pbVar12;
            while (((ulong)*pbVar12 < 0x21 && ((0x100002600U >> ((ulong)*pbVar12 & 0x3f) & 1) != 0))
                  ) {
              pbVar12 = pbVar12 + 1;
            }
            is->src_ = pbVar12;
          } while (*pbVar12 == 0x22);
        }
        uVar13 = 4;
      }
LAB_00102518:
      pCVar4 = is->head_;
      *(undefined4 *)(this + 0x30) = uVar13;
      *(long *)(this + 0x38) = (long)pbVar12 - (long)pCVar4;
    }
    return;
  }
  if (bVar3 == 0x74) {
    pCVar4 = is->src_;
    if (*pCVar4 != 't') {
      __assert_fail("is.Peek() == \'t\'",
                    "/workspace/llm4binary/github/license_all_cmakelists_25/satoshigeyuki[P]Centaurus/rapidjson/include/rapidjson/reader.h"
                    ,0x364,
                    "void rapidjson::GenericReader<rapidjson::UTF8<>, rapidjson::UTF8<>>::ParseTrue(InputStream &, Handler &) [SourceEncoding = rapidjson::UTF8<>, TargetEncoding = rapidjson::UTF8<>, StackAllocator = rapidjson::CrtAllocator, parseFlags = 0U, InputStream = rapidjson::GenericStringStream<rapidjson::UTF8<>>, Handler = rapidjson::GenericDocument<rapidjson::UTF8<>>]"
                   );
    }
    pCVar15 = pCVar4 + 1;
    is->src_ = pCVar15;
    if (pCVar4[1] == 'r') {
      pCVar15 = pCVar4 + 2;
      is->src_ = pCVar15;
      if (pCVar4[2] == 'u') {
        pCVar15 = pCVar4 + 3;
        is->src_ = pCVar15;
        if (pCVar4[3] == 'e') {
          is->src_ = pCVar4 + 4;
          pGVar11 = internal::Stack<rapidjson::CrtAllocator>::
                    Push<rapidjson::GenericValue<rapidjson::UTF8<char>,rapidjson::MemoryPoolAllocator<rapidjson::CrtAllocator>>>
                              (&handler->stack_,1);
          (pGVar11->data_).n = (Number)0x0;
          (pGVar11->data_).s.str = (Ch *)0x0;
          (pGVar11->data_).f.flags = 10;
          return;
        }
      }
    }
    if (*(int *)(this + 0x30) == 0) {
      pCVar4 = is->head_;
      *(undefined4 *)(this + 0x30) = 3;
      *(long *)(this + 0x38) = (long)pCVar15 - (long)pCVar4;
      return;
    }
    __assert_fail("!HasParseError()",
                  "/workspace/llm4binary/github/license_all_cmakelists_25/satoshigeyuki[P]Centaurus/rapidjson/include/rapidjson/reader.h"
                  ,0x36c,
                  "void rapidjson::GenericReader<rapidjson::UTF8<>, rapidjson::UTF8<>>::ParseTrue(InputStream &, Handler &) [SourceEncoding = rapidjson::UTF8<>, TargetEncoding = rapidjson::UTF8<>, StackAllocator = rapidjson::CrtAllocator, parseFlags = 0U, InputStream = rapidjson::GenericStringStream<rapidjson::UTF8<>>, Handler = rapidjson::GenericDocument<rapidjson::UTF8<>>]"
                 );
  }
  if (bVar3 == 0x6e) {
    ParseNull<0u,rapidjson::GenericStringStream<rapidjson::UTF8<char>>,rapidjson::GenericDocument<rapidjson::UTF8<char>,rapidjson::MemoryPoolAllocator<rapidjson::CrtAllocator>,rapidjson::CrtAllocator>>
              (this,is,handler);
    return;
  }
  pbVar20 = is->src_;
  bVar3 = *pbVar20;
  pbVar12 = pbVar20;
  bVar16 = bVar3;
  if (bVar3 == 0x2d) {
    bVar16 = pbVar20[1];
    pbVar12 = pbVar20 + 1;
  }
  pCVar4 = is->head_;
  if (bVar16 == 0x30) {
    uVar23 = (uint)pbVar12[1];
    pbVar12 = pbVar12 + 1;
    auVar32 = ZEXT1664(ZEXT816(0));
    bVar9 = false;
    uVar27 = 0;
    bVar7 = false;
    iVar10 = 0;
    bVar8 = false;
    uVar26 = 0;
    goto LAB_0010138b;
  }
  if ((byte)(bVar16 - 0x31) < 9) {
    bVar2 = pbVar12[1];
    uVar14 = (ulong)bVar2;
    pbVar12 = pbVar12 + 1;
    auVar32 = ZEXT1664(ZEXT816(0));
    uVar26 = bVar16 - 0x30;
    if (bVar3 == 0x2d) {
      if ((byte)(bVar2 - 0x30) < 10) {
        iVar10 = 0;
LAB_0010120e:
        if (uVar26 < 0xccccccc) {
LAB_00101217:
          iVar10 = iVar10 + 1;
          uVar26 = uVar26 * 10 + -0x30 + (int)uVar14;
          bVar2 = pbVar12[1];
          uVar14 = (ulong)bVar2;
          pbVar12 = pbVar12 + 1;
          if (9 < (byte)(bVar2 - 0x30)) goto LAB_001012e9;
          goto LAB_0010120e;
        }
        if (uVar26 != 0xccccccc) goto LAB_00101287;
        if ((byte)uVar14 < 0x39) goto LAB_00101217;
        uVar26 = 0xccccccc;
        uVar14 = 0x39;
LAB_00101287:
        uVar27 = (ulong)uVar26;
        if (bVar3 == 0x2d) {
          do {
            if ((0xccccccccccccccb < uVar27) && (0x38 < (byte)uVar14 || uVar27 != 0xccccccccccccccc)
               ) goto LAB_0010133f;
            iVar10 = iVar10 + 1;
            uVar24 = uVar14 & 0xf;
            bVar16 = pbVar12[1];
            uVar14 = (ulong)bVar16;
            pbVar12 = pbVar12 + 1;
            uVar27 = uVar24 + uVar27 * 10;
          } while ((byte)(bVar16 - 0x30) < 10);
        }
        else {
          do {
            if ((0x1999999999999998 < uVar27) &&
               (0x35 < (byte)uVar14 || uVar27 != 0x1999999999999999)) goto LAB_0010133f;
            iVar10 = iVar10 + 1;
            uVar24 = uVar14 & 0xf;
            bVar16 = pbVar12[1];
            uVar14 = (ulong)bVar16;
            pbVar12 = pbVar12 + 1;
            uVar27 = uVar24 + uVar27 * 10;
          } while ((byte)(bVar16 - 0x30) < 10);
        }
        auVar32 = ZEXT1664(ZEXT816(0));
        bVar9 = false;
        bVar7 = false;
        goto LAB_00101386;
      }
LAB_0010184d:
      iVar10 = 0;
    }
    else {
      if (9 < (byte)(bVar2 - 0x30)) goto LAB_0010184d;
      iVar10 = 0;
      do {
        if (0x19999998 < uVar26) {
          if (uVar26 != 0x19999999) goto LAB_00101287;
          if (0x35 < (byte)uVar14) {
            uVar26 = 0x19999999;
            goto LAB_00101287;
          }
        }
        iVar10 = iVar10 + 1;
        uVar26 = uVar26 * 10 + -0x30 + (int)uVar14;
        bVar2 = pbVar12[1];
        uVar14 = (ulong)bVar2;
        pbVar12 = pbVar12 + 1;
      } while ((byte)(bVar2 - 0x30) < 10);
    }
LAB_001012e9:
    uVar23 = (uint)bVar2;
    bVar9 = false;
    uVar27 = 0;
    bVar7 = false;
    bVar8 = false;
    goto LAB_0010138b;
  }
  if (*(int *)(this + 0x30) != 0) {
    __assert_fail("!HasParseError()",
                  "/workspace/llm4binary/github/license_all_cmakelists_25/satoshigeyuki[P]Centaurus/rapidjson/include/rapidjson/reader.h"
                  ,0x5fc,
                  "void rapidjson::GenericReader<rapidjson::UTF8<>, rapidjson::UTF8<>>::ParseNumber(InputStream &, Handler &) [SourceEncoding = rapidjson::UTF8<>, TargetEncoding = rapidjson::UTF8<>, StackAllocator = rapidjson::CrtAllocator, parseFlags = 0U, InputStream = rapidjson::GenericStringStream<rapidjson::UTF8<>>, Handler = rapidjson::GenericDocument<rapidjson::UTF8<>>]"
                 );
  }
  lVar25 = (long)pbVar12 - (long)pCVar4;
  *(undefined4 *)(this + 0x30) = 3;
LAB_00101580:
  *(long *)(this + 0x38) = lVar25;
  goto LAB_00101835;
LAB_00101518:
  do {
    pbVar20 = pbVar12 + 1;
    pbVar12 = pbVar12 + 1;
  } while ((byte)(*pbVar20 - 0x30) < 10);
LAB_00101612:
  auVar6._8_8_ = in_XMM4_Qb;
  auVar6._0_8_ = in_XMM4_Qa;
  auVar30 = vcvtusi2sd_avx512f(auVar6,uVar24);
  iVar22 = -iVar10;
  if (!bVar28) {
    iVar22 = iVar10;
  }
  auVar29._0_8_ = (double)((ulong)bVar7 * auVar29._0_8_ + (ulong)!bVar7 * auVar30._0_8_);
  auVar29._8_8_ = auVar30._8_8_;
  bVar7 = bVar9;
LAB_00101639:
  if (bVar7 == false) {
    if (bVar8) {
      if (bVar3 == 0x2d) {
        bVar9 = GenericDocument<rapidjson::UTF8<char>,_rapidjson::MemoryPoolAllocator<rapidjson::CrtAllocator>,_rapidjson::CrtAllocator>
                ::Int64(handler,-uVar27);
        if (!bVar9) {
          if (*(int *)(this + 0x30) != 0) {
            __assert_fail("!HasParseError()",
                          "/workspace/llm4binary/github/license_all_cmakelists_25/satoshigeyuki[P]Centaurus/rapidjson/include/rapidjson/reader.h"
                          ,0x6c3,
                          "void rapidjson::GenericReader<rapidjson::UTF8<>, rapidjson::UTF8<>>::ParseNumber(InputStream &, Handler &) [SourceEncoding = rapidjson::UTF8<>, TargetEncoding = rapidjson::UTF8<>, StackAllocator = rapidjson::CrtAllocator, parseFlags = 0U, InputStream = rapidjson::GenericStringStream<rapidjson::UTF8<>>, Handler = rapidjson::GenericDocument<rapidjson::UTF8<>>]"
                         );
          }
          *(undefined4 *)(this + 0x30) = 0x10;
          *(long *)(this + 0x38) = lVar25;
        }
      }
      else {
        pGVar11 = internal::Stack<rapidjson::CrtAllocator>::
                  Push<rapidjson::GenericValue<rapidjson::UTF8<char>,rapidjson::MemoryPoolAllocator<rapidjson::CrtAllocator>>>
                            (&handler->stack_,1);
        (pGVar11->data_).s.str = (Ch *)0x0;
        *(ulong *)&pGVar11->data_ = uVar27;
        uVar19 = (ushort)((uVar27 & 0xffffffff80000000) == 0) << 5 | 0x1d6;
        if (uVar27 >> 0x20 != 0) {
          uVar19 = (ushort)(-1 < (long)uVar27) << 7 | 0x116;
        }
        (pGVar11->data_).f.flags = uVar19;
      }
    }
    else if (bVar3 == 0x2d) {
      pGVar11 = internal::Stack<rapidjson::CrtAllocator>::
                Push<rapidjson::GenericValue<rapidjson::UTF8<char>,rapidjson::MemoryPoolAllocator<rapidjson::CrtAllocator>>>
                          (&handler->stack_,1);
      (pGVar11->data_).s.str = (Ch *)0x0;
      *(long *)&pGVar11->data_ = (long)(int)-uVar26;
      uVar17 = 0xb6;
      if ((int)uVar26 < 1) {
        uVar17 = 0x1f6;
      }
      (pGVar11->data_).f.flags = uVar17;
    }
    else {
      pGVar11 = internal::Stack<rapidjson::CrtAllocator>::
                Push<rapidjson::GenericValue<rapidjson::UTF8<char>,rapidjson::MemoryPoolAllocator<rapidjson::CrtAllocator>>>
                          (&handler->stack_,1);
      (pGVar11->data_).s.str = (Ch *)0x0;
      *(ulong *)&pGVar11->data_ = uVar14;
      (pGVar11->data_).f.flags = (ushort)(-1 < (int)uVar26) << 5 | 0x1d6;
    }
    goto LAB_00101835;
  }
  goto LAB_0010163e;
LAB_0010133f:
  auVar30 = vcvtusi2sd_avx512f(in_ZMM2._0_16_,uVar27);
  auVar32 = ZEXT1664(auVar30);
  do {
    iVar22 = (int)uVar14;
    bVar16 = pbVar12[1];
    uVar14 = (ulong)bVar16;
    pbVar12 = pbVar12 + 1;
    auVar30._0_8_ = (double)(iVar22 + -0x30);
    auVar30._8_8_ = in_ZMM3._8_8_;
    auVar30 = vfmadd132sd_fma(auVar32._0_16_,auVar30,ZEXT816(0x4024000000000000));
    auVar32 = ZEXT1664(auVar30);
  } while ((byte)(bVar16 - 0x30) < 10);
  bVar9 = true;
  bVar7 = true;
LAB_00101386:
  uVar23 = (uint)bVar16;
  bVar8 = true;
LAB_0010138b:
  auVar29 = auVar32._0_16_;
  lVar25 = (long)pbVar20 - (long)pCVar4;
  uVar14 = (ulong)uVar26;
  iVar22 = 0;
  if ((char)uVar23 != '.') {
    iVar21 = 0;
LAB_00101468:
    if ((uVar23 | 0x20) == 0x65) {
      uVar24 = uVar14;
      if (bVar8) {
        uVar24 = uVar27;
      }
      bVar9 = true;
      if (bVar7) {
        bVar9 = bVar7;
      }
      bVar16 = pbVar12[1];
      bVar28 = bVar16 != 0x2b;
      if ((bVar28) && (bVar16 != 0x2d)) {
        if (9 < (byte)(bVar16 - 0x30)) {
          pbVar12 = pbVar12 + 1;
LAB_00101564:
          if (*(int *)(this + 0x30) != 0) {
            __assert_fail("!HasParseError()",
                          "/workspace/llm4binary/github/license_all_cmakelists_25/satoshigeyuki[P]Centaurus/rapidjson/include/rapidjson/reader.h"
                          ,0x67c,
                          "void rapidjson::GenericReader<rapidjson::UTF8<>, rapidjson::UTF8<>>::ParseNumber(InputStream &, Handler &) [SourceEncoding = rapidjson::UTF8<>, TargetEncoding = rapidjson::UTF8<>, StackAllocator = rapidjson::CrtAllocator, parseFlags = 0U, InputStream = rapidjson::GenericStringStream<rapidjson::UTF8<>>, Handler = rapidjson::GenericDocument<rapidjson::UTF8<>>]"
                         );
          }
          lVar25 = (long)pbVar12 - (long)pCVar4;
          *(undefined4 *)(this + 0x30) = 0xf;
          goto LAB_00101580;
        }
        iVar10 = bVar16 - 0x30;
        pbVar12 = pbVar12 + 2;
      }
      else {
        pbVar20 = pbVar12 + 2;
        if (9 < (byte)(*pbVar20 - 0x30)) {
          pbVar12 = pbVar12 + 2;
          goto LAB_00101564;
        }
        pbVar12 = pbVar12 + 3;
        iVar10 = *pbVar20 - 0x30;
        if (bVar16 != 0x2b) {
          if (0 < iVar21) {
            __assert_fail("expFrac <= 0",
                          "/workspace/llm4binary/github/license_all_cmakelists_25/satoshigeyuki[P]Centaurus/rapidjson/include/rapidjson/reader.h"
                          ,0x667,
                          "void rapidjson::GenericReader<rapidjson::UTF8<>, rapidjson::UTF8<>>::ParseNumber(InputStream &, Handler &) [SourceEncoding = rapidjson::UTF8<>, TargetEncoding = rapidjson::UTF8<>, StackAllocator = rapidjson::CrtAllocator, parseFlags = 0U, InputStream = rapidjson::GenericStringStream<rapidjson::UTF8<>>, Handler = rapidjson::GenericDocument<rapidjson::UTF8<>>]"
                         );
          }
          bVar16 = *pbVar12;
          if ((byte)(bVar16 - 0x30) < 10) {
            do {
              iVar10 = iVar10 * 10 + -0x30 + (uint)bVar16;
              if ((iVar21 + 0x7ffffff7) / 10 < iVar10) goto LAB_00101518;
              pbVar12 = pbVar12 + 1;
              bVar16 = *pbVar12;
            } while ((byte)(bVar16 - 0x30) < 10);
          }
          else {
            bVar28 = true;
          }
          goto LAB_00101612;
        }
      }
      do {
        bVar16 = *pbVar12;
        if (9 < (byte)(bVar16 - 0x30)) {
          bVar28 = false;
          goto LAB_00101612;
        }
        pbVar12 = pbVar12 + 1;
        iVar10 = iVar10 * 10 + -0x30 + (uint)bVar16;
      } while (iVar10 <= 0x134 - iVar21);
      if (*(int *)(this + 0x30) != 0) {
        __assert_fail("!HasParseError()",
                      "/workspace/llm4binary/github/license_all_cmakelists_25/satoshigeyuki[P]Centaurus/rapidjson/include/rapidjson/reader.h"
                      ,0x677,
                      "void rapidjson::GenericReader<rapidjson::UTF8<>, rapidjson::UTF8<>>::ParseNumber(InputStream &, Handler &) [SourceEncoding = rapidjson::UTF8<>, TargetEncoding = rapidjson::UTF8<>, StackAllocator = rapidjson::CrtAllocator, parseFlags = 0U, InputStream = rapidjson::GenericStringStream<rapidjson::UTF8<>>, Handler = rapidjson::GenericDocument<rapidjson::UTF8<>>]"
                     );
      }
      *(undefined4 *)(this + 0x30) = 0xd;
      *(long *)(this + 0x38) = lVar25;
      goto LAB_00101835;
    }
    goto LAB_00101639;
  }
  pbVar20 = pbVar12 + 1;
  uVar23 = (uint)*pbVar20;
  pbVar12 = pbVar12 + 1;
  if ((byte)(*pbVar20 - 0x3a) < 0xf6) {
    if (*(int *)(this + 0x30) != 0) {
      __assert_fail("!HasParseError()",
                    "/workspace/llm4binary/github/license_all_cmakelists_25/satoshigeyuki[P]Centaurus/rapidjson/include/rapidjson/reader.h"
                    ,0x627,
                    "void rapidjson::GenericReader<rapidjson::UTF8<>, rapidjson::UTF8<>>::ParseNumber(InputStream &, Handler &) [SourceEncoding = rapidjson::UTF8<>, TargetEncoding = rapidjson::UTF8<>, StackAllocator = rapidjson::CrtAllocator, parseFlags = 0U, InputStream = rapidjson::GenericStringStream<rapidjson::UTF8<>>, Handler = rapidjson::GenericDocument<rapidjson::UTF8<>>]"
                   );
    }
    lVar25 = (long)pbVar12 - (long)pCVar4;
    *(undefined4 *)(this + 0x30) = 0xe;
    goto LAB_00101580;
  }
  iVar21 = 0;
  if (bVar9) {
LAB_0010141b:
    do {
      auVar29 = auVar32._0_16_;
      if (0x39 < (byte)uVar23) goto LAB_00101468;
      if (iVar10 < 0x11) {
        iVar21 = iVar21 + -1;
        auVar34._0_8_ = (double)(int)(uVar23 - 0x30);
        auVar34._8_8_ = in_XMM4_Qb;
        auVar30 = vfmadd231sd_fma(auVar34,auVar29,ZEXT816(0x4024000000000000));
        if (0.0 < auVar30._0_8_) {
          iVar10 = iVar10 + 1;
        }
        auVar32 = ZEXT1664(auVar30);
      }
      auVar29 = auVar32._0_16_;
      pbVar20 = pbVar12 + 1;
      uVar23 = (uint)*pbVar20;
      pbVar12 = pbVar12 + 1;
    } while (0x2f < *pbVar20);
    iVar22 = 0;
    goto LAB_00101639;
  }
  if (!bVar8) {
    uVar27 = uVar14;
  }
  iVar21 = 0;
  pbVar20 = pbVar12;
  do {
    if ((0x39 < (byte)uVar23) || (uVar27 >> 0x35 != 0)) {
      auVar30 = vcvtusi2sd_avx512f(in_ZMM3._0_16_,uVar27);
      auVar32 = ZEXT1664(auVar30);
      bVar7 = true;
      pbVar12 = pbVar20;
      goto LAB_0010141b;
    }
    iVar21 = iVar21 + -1;
    pbVar12 = pbVar20 + 1;
    uVar27 = (ulong)(uVar23 - 0x30) + uVar27 * 10;
    iVar10 = iVar10 + (uint)(uVar27 != 0);
    pbVar1 = pbVar20 + 1;
    uVar23 = (uint)*pbVar1;
    pbVar20 = pbVar12;
  } while (0x2f < *pbVar1);
  auVar29._0_8_ = (double)(long)uVar27;
  auVar29._8_8_ = in_ZMM3._8_8_;
  iVar22 = 0;
LAB_0010163e:
  uVar23 = iVar22 + iVar21;
  dVar31 = auVar29._0_8_;
  if ((int)uVar23 < -0x134) {
    auVar33 = SUB6416(ZEXT864(0),0) << 0x40;
    if (0xfffffd97 < uVar23) {
      auVar33._0_8_ =
           (dVar31 / 1e+308) / *(double *)(internal::Pow10(int)::e + (ulong)(-uVar23 - 0x134) * 8);
      auVar33._8_8_ = auVar29._8_8_;
      goto LAB_001017c2;
    }
  }
  else {
    if ((int)uVar23 < 0) {
      auVar33._0_8_ = dVar31 / *(double *)(internal::Pow10(int)::e + (ulong)-uVar23 * 8);
      auVar33._8_8_ = auVar29._8_8_;
    }
    else {
      if (0x134 < uVar23) {
        __assert_fail("n >= 0 && n <= 308",
                      "/workspace/llm4binary/github/license_all_cmakelists_25/satoshigeyuki[P]Centaurus/rapidjson/include/rapidjson/internal/pow10.h"
                      ,0x30,"double rapidjson::internal::Pow10(int)");
      }
      auVar33._8_8_ = 0;
      auVar33._0_8_ = dVar31 * *(double *)(internal::Pow10(int)::e + (ulong)uVar23 * 8);
    }
LAB_001017c2:
    if (1.79769313486232e+308 < auVar33._0_8_) {
      if (*(int *)(this + 0x30) != 0) {
        __assert_fail("!HasParseError()",
                      "/workspace/llm4binary/github/license_all_cmakelists_25/satoshigeyuki[P]Centaurus/rapidjson/include/rapidjson/reader.h"
                      ,0x6ab,
                      "void rapidjson::GenericReader<rapidjson::UTF8<>, rapidjson::UTF8<>>::ParseNumber(InputStream &, Handler &) [SourceEncoding = rapidjson::UTF8<>, TargetEncoding = rapidjson::UTF8<>, StackAllocator = rapidjson::CrtAllocator, parseFlags = 0U, InputStream = rapidjson::GenericStringStream<rapidjson::UTF8<>>, Handler = rapidjson::GenericDocument<rapidjson::UTF8<>>]"
                     );
      }
      *(undefined4 *)(this + 0x30) = 0xd;
      *(long *)(this + 0x38) = lVar25;
      goto LAB_00101835;
    }
  }
  pGVar11 = internal::Stack<rapidjson::CrtAllocator>::
            Push<rapidjson::GenericValue<rapidjson::UTF8<char>,rapidjson::MemoryPoolAllocator<rapidjson::CrtAllocator>>>
                      (&handler->stack_,1);
  auVar5._8_8_ = 0x8000000000000000;
  auVar5._0_8_ = 0x8000000000000000;
  auVar30 = vxorpd_avx512vl(auVar33,auVar5);
  (pGVar11->data_).s.str = (Ch *)0x216000000000000;
  (pGVar11->data_).n =
       (Number)((ulong)(bVar3 == 0x2d) * auVar30._0_8_ + (ulong)(bVar3 != 0x2d) * auVar33._0_8_);
LAB_00101835:
  is->src_ = pbVar12;
  is->head_ = pCVar4;
  return;
}

Assistant:

Ch Peek() const { return *src_; }